

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerNewScIntArray(Lowerer *this,Instr *arrInstr)

{
  ProfileId index;
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  JITTimeFunctionBody *pJVar4;
  intptr_t weakFuncRef;
  undefined4 *puVar5;
  JITTimeProfileInfo *pJVar6;
  ArrayCallSiteInfo *arrayInfo;
  intptr_t arrayInfoAddr;
  AddrOpnd *pAVar7;
  Opnd *opndArg;
  JnHelperMethod helperMethod;
  
  pIVar1 = arrInstr->m_prev;
  helperMethod = HelperScrArr_OP_NewScIntArray;
  if ((arrInstr->m_kind == InstrKindJitProfiling) || (arrInstr->m_kind == InstrKindProfiled)) {
    pJVar4 = JITTimeWorkItem::GetJITFunctionBody(arrInstr->m_func->m_workItem);
    bVar3 = JITTimeFunctionBody::HasProfileInfo(pJVar4);
    if (bVar3) {
      weakFuncRef = Func::GetWeakFuncRef(arrInstr->m_func);
      if (weakFuncRef != 0) {
        if ((arrInstr->m_kind != InstrKindProfiled) && (arrInstr->m_kind != InstrKindJitProfiling))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        index = *(ProfileId *)&arrInstr[1]._vptr_Instr;
        pJVar4 = JITTimeWorkItem::GetJITFunctionBody(arrInstr->m_func->m_workItem);
        pJVar6 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar4);
        arrayInfo = JITTimeProfileInfo::GetArrayCallSiteInfo(pJVar6,index);
        pJVar4 = JITTimeWorkItem::GetJITFunctionBody(arrInstr->m_func->m_workItem);
        pJVar6 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar4);
        arrayInfoAddr = JITTimeProfileInfo::GetArrayCallSiteInfoAddr(pJVar6,index);
        if (arrInstr->m_kind == InstrKindProfiled) {
          bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,CopyOnAccessArrayPhase);
          if ((bVar3) || (((arrayInfo->field_0).bits & 4) != 0)) {
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,CopyOnAccessArrayPhase);
            if (!bVar3) {
              GenerateProfiledNewScIntArrayFastPath
                        (this,arrInstr,arrayInfo,arrayInfoAddr,weakFuncRef);
            }
          }
        }
        pAVar7 = IR::AddrOpnd::New(weakFuncRef,AddrOpndKindDynamicFunctionBodyWeakRef,this->m_func,
                                   false,(Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar7->super_Opnd);
        pAVar7 = IR::AddrOpnd::New(arrayInfoAddr,AddrOpndKindDynamicArrayCallSiteInfo,this->m_func,
                                   false,(Var)0x0);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,&pAVar7->super_Opnd);
        helperMethod = HelperScrArr_ProfiledNewScIntArray;
      }
    }
  }
  LoadScriptContext(this,arrInstr);
  opndArg = IR::Instr::UnlinkSrc1(arrInstr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,arrInstr,opndArg);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,arrInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScIntArray(IR::Instr *arrInstr)
{
    IR::Instr *instrPrev = arrInstr->m_prev;
    IR::JnHelperMethod helperMethod = IR::HelperScrArr_OP_NewScIntArray;

    if ((arrInstr->IsJitProfilingInstr() || arrInstr->IsProfiledInstr()) && arrInstr->m_func->HasProfileInfo())
    {
        intptr_t weakFuncRef = arrInstr->m_func->GetWeakFuncRef();
        if (weakFuncRef)
        {
            // Technically a load of the same memory address either way.
            Js::ProfileId profileId =
                arrInstr->IsJitProfilingInstr()
                    ? arrInstr->AsJitProfilingInstr()->profileId
                    : static_cast<Js::ProfileId>(arrInstr->AsProfiledInstr()->u.profileId);
            Js::ArrayCallSiteInfo *arrayInfo = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfo(profileId);
            intptr_t arrayInfoAddr = arrInstr->m_func->GetReadOnlyProfileInfo()->GetArrayCallSiteInfoAddr(profileId);

            // Only do fast-path if it isn't a JitProfiling instr and not copy-on-access array
            if (arrInstr->IsProfiledInstr()
#if ENABLE_COPYONACCESS_ARRAY
                && (PHASE_OFF1(Js::Phase::CopyOnAccessArrayPhase) || arrayInfo->isNotCopyOnAccessArray) && !PHASE_FORCE1(Js::Phase::CopyOnAccessArrayPhase)
#endif
                )
            {
                GenerateProfiledNewScIntArrayFastPath(arrInstr, arrayInfo, arrayInfoAddr, weakFuncRef);
            }

            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(weakFuncRef, IR::AddrOpndKindDynamicFunctionBodyWeakRef, m_func));
            m_lowererMD.LoadHelperArgument(arrInstr, IR::AddrOpnd::New(arrayInfoAddr, IR::AddrOpndKindDynamicArrayCallSiteInfo, m_func));
            helperMethod = IR::HelperScrArr_ProfiledNewScIntArray;
        }
    }

    LoadScriptContext(arrInstr);

    IR::Opnd *elementsOpnd = arrInstr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(arrInstr, elementsOpnd);
    m_lowererMD.ChangeToHelperCall(arrInstr, helperMethod);

    return instrPrev;
}